

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall soplex::SPxSteepPR<double>::removedCoVecs(SPxSteepPR<double> *this,int *perm)

{
  SPxSolverBase<double> *pSVar1;
  pointer pdVar2;
  uint uVar3;
  ulong uVar4;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  pdVar2 = (pSVar1->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(pSVar1->coWeights).val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      if (-1 < (long)perm[uVar4]) {
        pdVar2[perm[uVar4]] = pdVar2[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  VectorBase<double>::reDim(&pSVar1->coWeights,(pSVar1->thecovectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedCoVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& coWeights = this->thesolver->coWeights;
   int i;
   int j = coWeights.dim();

   for(i = 0; i < j; ++i)
   {
      if(perm[i] >= 0)
         coWeights[perm[i]] = coWeights[i];
   }

   coWeights.reDim(this->thesolver->dim());
}